

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_ccab2::JsonNumber::JsonNumber(JsonNumber *this)

{
  JsonNumber *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__JsonNumber_0025a960;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  callbacks_proxy<mock_json_callbacks>::callbacks_proxy
            (&this->proxy_,&(this->callbacks_).super_mock_json_callbacks);
  return;
}

Assistant:

JsonNumber ()
                : proxy_{callbacks_} {}